

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O2

void __thiscall bgui::ImageWindow::ImageWindow(ImageWindow *this)

{
  string asStack_38 [32];
  
  BaseWindow::BaseWindow(&this->super_BaseWindow,"Image",100,100);
  (this->super_BaseWindow)._vptr_BaseWindow = (_func_int **)&PTR__ImageWindow_00122730;
  (this->helptext)._M_dataplus._M_p = (pointer)&(this->helptext).field_2;
  (this->helptext)._M_string_length = 0;
  (this->helptext).field_2._M_local_buf[0] = '\0';
  this->adapt = (ImageAdapterBase *)0x0;
  this->del = false;
  this->lastkey = '\0';
  this->imx = 0;
  this->imy = 0;
  this->xp = 0;
  this->yp = 0;
  this->showinfo = false;
  (anonymous_namespace)::createHelpText_abi_cxx11_();
  std::__cxx11::string::append((string *)&this->helptext);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

ImageWindow::ImageWindow() : BaseWindow("Image", 100, 100)
{
  adapt=0;
  del=false;
  lastkey='\0';
  imx=imy=0;
  xp=yp=0;
  showinfo=false;

  addHelpText(createHelpText());
}